

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParserBase::Skip(UDMFParserBase *this)

{
  bool bVar1;
  int iVar2;
  int local_14;
  int level;
  UDMFParserBase *this_local;
  
  iVar2 = FIntCVar::operator_cast_to_int(&developer);
  if (1 < iVar2) {
    FScanner::ScriptMessage(&this->sc,"Ignoring unknown UDMF key \"%s\".",(this->sc).String);
  }
  bVar1 = FScanner::CheckToken(&this->sc,0x7b);
  if (bVar1) {
    local_14 = 1;
    do {
      while( true ) {
        bVar1 = FScanner::GetToken(&this->sc);
        if (!bVar1) {
          return;
        }
        if ((this->sc).TokenType == 0x7d) break;
        if ((this->sc).TokenType == 0x7b) {
          local_14 = local_14 + 1;
        }
      }
      local_14 = local_14 + -1;
    } while (local_14 != 0);
    FScanner::UnGet(&this->sc);
  }
  else {
    FScanner::MustGetToken(&this->sc,0x3d);
    do {
      FScanner::MustGetAnyToken(&this->sc);
    } while ((this->sc).TokenType != 0x3b);
  }
  return;
}

Assistant:

void UDMFParserBase::Skip()
{
	if (developer >= DMSG_WARNING) sc.ScriptMessage("Ignoring unknown UDMF key \"%s\".", sc.String);
	if(sc.CheckToken('{'))
	{
		int level = 1;
		while(sc.GetToken())
		{
			if (sc.TokenType == '}')
			{
				level--;
				if(level == 0)
				{
					sc.UnGet();
					break;
				}
			}
			else if (sc.TokenType == '{')
			{
				level++;
			}
		}
	}
	else
	{
		sc.MustGetToken('=');
		do
		{
			sc.MustGetAnyToken();
		}
		while(sc.TokenType != ';');
	}
}